

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O0

void test_base_swaps<Gudhi::persistence_matrix::Matrix<Boundary_options<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true>>>
               (void)

{
  Column_settings **this;
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  initializer_list<unsigned_int> __l_01;
  reference pvVar1;
  reference pvVar2;
  uint local_1d0 [2];
  iterator local_1c8;
  size_type local_1c0;
  uint local_1b4 [3];
  iterator local_1a8;
  size_type local_1a0;
  uint local_198 [2];
  iterator local_190;
  size_type local_188;
  undefined1 local_170 [8];
  Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_> m;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  columns;
  
  build_simple_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true>>>>
            ();
  Gudhi::persistence_matrix::
  Matrix<Boundary_options<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true>>::
  Matrix<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Matrix<Boundary_options<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true>>
              *)local_170,
             (vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              *)&m.matrix_.colSettings_,5);
  test_content_equality<Gudhi::persistence_matrix::Matrix<Boundary_options<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true>>>
            ((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              *)&m.matrix_.colSettings_,
             (Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>
              *)local_170);
  Gudhi::persistence_matrix::
  Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>::
  swap_columns((Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>
                *)local_170,3,5);
  Gudhi::persistence_matrix::
  Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>::
  swap_columns((Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>
                *)local_170,5,1);
  this = &m.matrix_.colSettings_;
  pvVar1 = std::
           vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         *)this,3);
  pvVar2 = std::
           vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         *)this,5);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::swap(pvVar1,pvVar2);
  pvVar1 = std::
           vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         *)this,5);
  pvVar2 = std::
           vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         *)this,1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::swap(pvVar1,pvVar2);
  test_content_equality<Gudhi::persistence_matrix::Matrix<Boundary_options<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true>>>
            ((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              *)this,(Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>
                      *)local_170);
  Gudhi::persistence_matrix::
  Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>::
  swap_rows((Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>
             *)local_170,3,5);
  Gudhi::persistence_matrix::
  Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>::
  swap_rows((Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>
             *)local_170,5,1);
  local_198[0] = 2;
  local_198[1] = 5;
  local_190 = local_198;
  local_188 = 2;
  pvVar1 = std::
           vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         *)&m.matrix_.colSettings_,4);
  __l_01._M_len = local_188;
  __l_01._M_array = local_190;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(pvVar1,__l_01);
  local_1b4[0] = 1;
  local_1b4[1] = 3;
  local_1b4[2] = 4;
  local_1a8 = local_1b4;
  local_1a0 = 3;
  pvVar1 = std::
           vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         *)&m.matrix_.colSettings_,6);
  __l_00._M_len = local_1a0;
  __l_00._M_array = local_1a8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(pvVar1,__l_00);
  local_1d0[0] = 0;
  local_1d0[1] = 5;
  local_1c8 = local_1d0;
  local_1c0 = 2;
  pvVar1 = std::
           vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         *)&m.matrix_.colSettings_,1);
  __l._M_len = local_1c0;
  __l._M_array = local_1c8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(pvVar1,__l);
  test_content_equality<Gudhi::persistence_matrix::Matrix<Boundary_options<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true>>>
            ((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              *)&m.matrix_.colSettings_,
             (Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>
              *)local_170);
  Gudhi::persistence_matrix::
  Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>::
  ~Matrix((Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>
           *)local_170);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)&m.matrix_.colSettings_);
  return;
}

Assistant:

void test_base_swaps() {
  auto columns = build_simple_boundary_matrix<typename Matrix::Column>();
  Matrix m(columns, 5);

  test_content_equality(columns, m);

  m.swap_columns(3, 5);
  if constexpr (Matrix::Option_list::column_indexation_type == Column_indexation_types::IDENTIFIER) {
    m.swap_columns(3, 1);
  } else {
    m.swap_columns(5, 1);
    columns[3].swap(columns[5]);
    columns[5].swap(columns[1]);
  }

  test_content_equality(columns, m);

  m.swap_rows(3, 5);
  m.swap_rows(5, 1);

  if constexpr (Matrix::Option_list::is_z2) {
    columns[4] = {2, 5};
    columns[6] = {1, 3, 4};
    if constexpr (Matrix::Option_list::column_indexation_type == Column_indexation_types::IDENTIFIER) {
      columns[3] = {0, 5};
      columns[5] = {0, 2};
    } else {
      columns[1] = {0, 5};
    }
  } else {
    columns[4] = {{2, 4}, {5, 1}};
    columns[6] = {{1, 1}, {3, 4}, {4, 1}};
    if constexpr (Matrix::Option_list::column_indexation_type == Column_indexation_types::IDENTIFIER) {
      columns[3] = {{0, 1}, {5, 4}};
      columns[5] = {{0, 1}, {2, 4}};
    } else {
      columns[1] = {{0, 1}, {5, 4}};
    }
  }

  test_content_equality(columns, m);
}